

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O0

void __thiscall Assimp::Discreet3DSImporter::ParseMainChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  uint oldReadLimit;
  int chunkSize;
  Discreet3DSImporter *pDStack_10;
  Chunk chunk;
  Discreet3DSImporter *this_local;
  
  pDStack_10 = this;
  do {
    do {
      uVar1 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
      if (uVar1 < 6) {
        return;
      }
      ReadChunk(this,(Chunk *)((long)&oldReadLimit + 2));
      iVar2 = chunkSize + -6;
    } while (iVar2 < 1);
    this_00 = this->stream;
    iVar3 = StreamReader<false,_false>::GetCurrentPos(this_00);
    uVar1 = StreamReader<false,_false>::SetReadLimit(this_00,iVar3 + iVar2);
    if (oldReadLimit._2_2_ == 0x4d4d) {
LAB_00593cd8:
      ParseEditorChunk(this);
    }
    else if (oldReadLimit._2_2_ == -0x3dc3) {
      this->bIsPrj = true;
      goto LAB_00593cd8;
    }
    StreamReader<false,_false>::SkipToReadLimit(this->stream);
    StreamReader<false,_false>::SetReadLimit(this->stream,uVar1);
    uVar1 = StreamReader<false,_false>::GetRemainingSizeToLimit(this->stream);
    if (uVar1 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseMainChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {

    case Discreet3DS::CHUNK_PRJ:
        bIsPrj = true;
    case Discreet3DS::CHUNK_MAIN:
        ParseEditorChunk();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
    // recursively continue processing this hierarchy level
    return ParseMainChunk();
}